

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O2

int __thiscall Fossilize::ExternalReplayer::Impl::kill(Impl *this,__pid_t __pid,int __sig)

{
  FILE *__stream;
  int iVar1;
  ssize_t sVar2;
  uint *puVar3;
  int iVar4;
  char dummy;
  
  iVar4 = this->pid;
  if (iVar4 < 0) {
LAB_001771e3:
    iVar4 = 0;
  }
  else {
    if (-1 < this->kill_fd) {
      sVar2 = read(this->kill_fd,&dummy,1);
      close(this->kill_fd);
      this->kill_fd = -1;
      if (sVar2 < 0) goto LAB_001771e3;
      iVar4 = this->pid;
    }
    iVar1 = killpg(iVar4,9);
    __stream = _stderr;
    iVar4 = (int)CONCAT71((int7)((ulong)this >> 8),1);
    if (iVar1 != 0) {
      puVar3 = (uint *)__errno_location();
      iVar4 = 0;
      fprintf(__stream,"Fossilize INFO: ExternalReplayer::Impl::kill(): Failed to kill: errno %d.\n"
              ,(ulong)*puVar3);
    }
  }
  return iVar4;
}

Assistant:

bool ExternalReplayer::Impl::kill()
{
	if (pid < 0)
		return false;

	if (kill_fd >= 0)
	{
		// Before we attempt to kill, we must make sure that the new process group has been created.
		// This read will block until we close the FD in the forked process, ensuring that we
		// can immediately call killpg() against it, since that close will only happen after setpgid().
		char dummy;
		if (::read(kill_fd, &dummy, sizeof(dummy)) < 0)
		{
			close(kill_fd);
			kill_fd = -1;
			return false;
		}
		close(kill_fd);
		kill_fd = -1;
	}

	bool ret = killpg(pid, SIGKILL) == 0;
	if (!ret)
		LOGI("ExternalReplayer::Impl::kill(): Failed to kill: errno %d.\n", errno);
	return ret;
}